

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTSEQDecStop(octet *der,der_anchor_t *anchor)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long *in_RSI;
  ulong in_RDI;
  octet *val;
  undefined8 in_stack_ffffffffffffffe0;
  size_t local_8;
  
  lVar1 = *in_RSI;
  sVar2 = derTEnc((octet *)in_RSI,(u32)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  sVar3 = derLEnc((octet *)0x0,in_RSI[3]);
  uVar4 = lVar1 + sVar2 + sVar3;
  if (in_RDI < uVar4) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = 0xffffffffffffffff;
    if (in_RDI == uVar4 + in_RSI[3]) {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t derTSEQDecStop(const octet der[], const der_anchor_t* anchor)
{
	const octet* val;
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// определить начало вложенных данных
	val = anchor->der + derTEnc(0, anchor->tag) + derLEnc(0, anchor->len);
	if (val > der)
		return SIZE_MAX;
	// сравнить длину вложенных данных с сохраненной длиной
	return (der == val + anchor->len) ? 0 : SIZE_MAX;
}